

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O2

int file_is_obu(ObuDecInputContext *obu_ctx)

{
  AvxInputContext *input_ctx;
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint8_t *__dest;
  char *__ptr;
  undefined1 buffered;
  size_t *bytes_read_00;
  size_t __size;
  size_t annexb_header_length;
  size_t length_of_unit_size;
  size_t payload_length;
  size_t bytes_read;
  uint64_t unit_size;
  size_t payload_bytes;
  uint8_t detect_buf [34];
  ObuHeader obu_header;
  
  if (obu_ctx == (ObuDecInputContext *)0x0) {
    return 0;
  }
  input_ctx = obu_ctx->avx_ctx;
  if (input_ctx == (AvxInputContext *)0x0) {
    return 0;
  }
  detect_buf[0x10] = '\0';
  detect_buf[0x11] = '\0';
  detect_buf[0x12] = '\0';
  detect_buf[0x13] = '\0';
  detect_buf[0x14] = '\0';
  detect_buf[0x15] = '\0';
  detect_buf[0x16] = '\0';
  detect_buf[0x17] = '\0';
  detect_buf[0x18] = '\0';
  detect_buf[0x19] = '\0';
  detect_buf[0x1a] = '\0';
  detect_buf[0x1b] = '\0';
  detect_buf[0x1c] = '\0';
  detect_buf[0x1d] = '\0';
  detect_buf[0x1e] = '\0';
  detect_buf[0x1f] = '\0';
  detect_buf[0] = '\0';
  detect_buf[1] = '\0';
  detect_buf[2] = '\0';
  detect_buf[3] = '\0';
  detect_buf[4] = '\0';
  detect_buf[5] = '\0';
  detect_buf[6] = '\0';
  detect_buf[7] = '\0';
  detect_buf[8] = '\0';
  detect_buf[9] = '\0';
  detect_buf[10] = '\0';
  detect_buf[0xb] = '\0';
  detect_buf[0xc] = '\0';
  detect_buf[0xd] = '\0';
  detect_buf[0xe] = '\0';
  detect_buf[0xf] = '\0';
  detect_buf[0x20] = '\0';
  detect_buf[0x21] = '\0';
  iVar3 = obu_ctx->is_annexb;
  payload_length = 0;
  obu_header.has_extension = 0;
  obu_header.temporal_layer_id = 0;
  obu_header.spatial_layer_id = 0;
  obu_header._28_4_ = 0;
  length_of_unit_size = 0;
  obu_header.size = 0;
  obu_header.type = 0;
  obu_header._9_3_ = 0;
  obu_header.has_size_field = 0;
  annexb_header_length = 0;
  unit_size = 0;
  if (iVar3 == 0) {
LAB_00123c5c:
    bytes_read_00 = &bytes_read;
    bytes_read = 0;
    iVar2 = obudec_read_obu_header_and_size
                      (input_ctx,0x22 - annexb_header_length,iVar3,detect_buf + annexb_header_length
                       ,bytes_read_00,&payload_length,&obu_header,true);
    buffered = SUB81(bytes_read_00,0);
    if (iVar2 == 0) {
      if (iVar3 != 0) {
        bytes_read = bytes_read + annexb_header_length;
      }
      if ((byte)(obu_header.type - OBU_FRAME_HEADER) < 0xfe) goto LAB_00123e0f;
      if (obu_header.has_size_field == 0) {
        if (iVar3 != 0) goto LAB_00123ce4;
        __ptr = "obudec: OBU size fields required, cannot decode input.\n";
        __size = 0x37;
      }
      else if ((obu_header.type == OBU_TEMPORAL_DELIMITER) && (payload_length != 0)) {
        __ptr = "obudec: Invalid OBU_TEMPORAL_DELIMITER payload length (non-zero).";
        __size = 0x41;
      }
      else {
LAB_00123ce4:
        __dest = (uint8_t *)malloc(0x7d000);
        sVar1 = bytes_read;
        obu_ctx->buffer = __dest;
        if (__dest != (uint8_t *)0x0) {
          obu_ctx->buffer_capacity = 0x7d000;
          memcpy(__dest,detect_buf,bytes_read);
          obu_ctx->bytes_buffered = sVar1;
          if (payload_length == 0) {
            return 1;
          }
          if (0x7d000 - sVar1 < payload_length) {
            fwrite("obudec: First OBU\'s payload is too large\n",0x29,1,_stderr);
          }
          else {
            payload_bytes = 0;
            iVar3 = obudec_read_obu_payload
                              (input_ctx,payload_length,__dest + sVar1,&payload_bytes,
                               (_Bool)buffered);
            if (-1 < iVar3) {
              obu_ctx->bytes_buffered = obu_ctx->bytes_buffered + payload_bytes;
              return 1;
            }
          }
          rewind_detect(input_ctx);
          obudec_free(obu_ctx);
          return 0;
        }
        __ptr = "Out of memory.\n";
        __size = 0xf;
      }
    }
    else {
      __ptr = "obudec: Failure reading first OBU.\n";
      __size = 0x23;
    }
  }
  else {
    iVar2 = obudec_read_leb128(input_ctx,detect_buf,&length_of_unit_size,&unit_size,true);
    if (iVar2 == 0) {
      iVar2 = obudec_read_leb128(input_ctx,detect_buf + length_of_unit_size,&annexb_header_length,
                                 &unit_size,true);
      if (iVar2 == 0) {
        annexb_header_length = annexb_header_length + length_of_unit_size;
        goto LAB_00123c5c;
      }
      __ptr = "obudec: Failure reading frame unit header\n";
      __size = 0x2a;
    }
    else {
      __ptr = "obudec: Failure reading temporal unit header\n";
      __size = 0x2d;
    }
  }
  fwrite(__ptr,__size,1,_stderr);
LAB_00123e0f:
  rewind_detect(input_ctx);
  return 0;
}

Assistant:

int file_is_obu(struct ObuDecInputContext *obu_ctx) {
  if (!obu_ctx || !obu_ctx->avx_ctx) return 0;

  struct AvxInputContext *avx_ctx = obu_ctx->avx_ctx;
  uint8_t detect_buf[OBU_DETECTION_SIZE] = { 0 };
  const int is_annexb = obu_ctx->is_annexb;
  size_t payload_length = 0;
  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  size_t length_of_unit_size = 0;
  size_t annexb_header_length = 0;
  uint64_t unit_size = 0;

  if (is_annexb) {
    // read the size of first temporal unit
    if (obudec_read_leb128(avx_ctx, &detect_buf[0], &length_of_unit_size,
                           &unit_size, /*buffered=*/true) != 0) {
      fprintf(stderr, "obudec: Failure reading temporal unit header\n");
      rewind_detect(avx_ctx);
      return 0;
    }

    // read the size of first frame unit
    if (obudec_read_leb128(avx_ctx, &detect_buf[length_of_unit_size],
                           &annexb_header_length, &unit_size,
                           /*buffered=*/true) != 0) {
      fprintf(stderr, "obudec: Failure reading frame unit header\n");
      rewind_detect(avx_ctx);
      return 0;
    }
    annexb_header_length += length_of_unit_size;
  }

  size_t bytes_read = 0;
  if (obudec_read_obu_header_and_size(
          avx_ctx, OBU_DETECTION_SIZE - annexb_header_length, is_annexb,
          &detect_buf[annexb_header_length], &bytes_read, &payload_length,
          &obu_header, /*buffered=*/true) != 0) {
    fprintf(stderr, "obudec: Failure reading first OBU.\n");
    rewind_detect(avx_ctx);
    return 0;
  }

  if (is_annexb) {
    bytes_read += annexb_header_length;
  }

  if (obu_header.type != OBU_TEMPORAL_DELIMITER &&
      obu_header.type != OBU_SEQUENCE_HEADER) {
    rewind_detect(avx_ctx);
    return 0;
  }

  if (obu_header.has_size_field) {
    if (obu_header.type == OBU_TEMPORAL_DELIMITER && payload_length != 0) {
      fprintf(
          stderr,
          "obudec: Invalid OBU_TEMPORAL_DELIMITER payload length (non-zero).");
      rewind_detect(avx_ctx);
      return 0;
    }
  } else if (!is_annexb) {
    fprintf(stderr, "obudec: OBU size fields required, cannot decode input.\n");
    rewind_detect(avx_ctx);
    return 0;
  }

  // Appears that input is valid Section 5 AV1 stream.
  obu_ctx->buffer = (uint8_t *)malloc(OBU_BUFFER_SIZE);
  if (!obu_ctx->buffer) {
    fprintf(stderr, "Out of memory.\n");
    rewind_detect(avx_ctx);
    return 0;
  }
  obu_ctx->buffer_capacity = OBU_BUFFER_SIZE;

  memcpy(obu_ctx->buffer, &detect_buf[0], bytes_read);
  obu_ctx->bytes_buffered = bytes_read;
  // If the first OBU is a SEQUENCE_HEADER, then it will have a payload.
  // We need to read this in so that our buffer only contains complete OBUs.
  if (payload_length > 0) {
    if (payload_length > (obu_ctx->buffer_capacity - bytes_read)) {
      fprintf(stderr, "obudec: First OBU's payload is too large\n");
      rewind_detect(avx_ctx);
      obudec_free(obu_ctx);
      return 0;
    }

    size_t payload_bytes = 0;
    const int status = obudec_read_obu_payload(
        avx_ctx, payload_length, &obu_ctx->buffer[bytes_read], &payload_bytes,
        /*buffered=*/false);
    if (status < 0) {
      rewind_detect(avx_ctx);
      obudec_free(obu_ctx);
      return 0;
    }
    obu_ctx->bytes_buffered += payload_bytes;
  }
  return 1;
}